

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::decide_to_pick_reconst(particleSamples *this,int monval)

{
  int flag;
  int monval_local;
  particleSamples *this_local;
  
  flag = 0;
  if ((this->particle_monval == 0x14d) && (flag = (int)(monval == 0x141), monval == -0x141)) {
    flag = 2;
  }
  return flag;
}

Assistant:

int particleSamples::decide_to_pick_reconst(int monval) {
    int flag = 0;
    if (particle_monval == 333) {
        // particle of interest is phi(1020)
        // collect (K^+, K^-) pairs for reconstruction
        if (monval == 321) {  // current particle is K^+ from a decay
            flag = 1;
        }
        if (monval == -321) {  // current particle is K^- from a decay
            flag = 2;
        }
    }
    return (flag);
}